

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_write_buffer(FILE *f,uint32_t n,char *data,char *errmsg)

{
  size_t sVar1;
  ulong __n;
  uint32_t n_local;
  
  n_local = n;
  sVar1 = fwrite(&n_local,1,4,(FILE *)f);
  if (sVar1 == 4) {
    __n = (ulong)n_local;
    sVar1 = fwrite(data,1,__n,(FILE *)f);
    if (sVar1 == __n) {
      return;
    }
  }
  mcpl_error(errmsg);
}

Assistant:

MCPL_LOCAL void mcpl_write_buffer(FILE* f, uint32_t n, const char * data, const char * errmsg)
{
  size_t nb = fwrite(&n, 1, sizeof(n), f);
  if (nb!=sizeof(n))
    mcpl_error(errmsg);
  nb = fwrite(data, 1, n, f);
  if (nb!=n)
    mcpl_error(errmsg);
}